

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>const&>,std::tuple<std::__cxx11::string_const&>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *args_1,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_2)

{
  size_t c;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  reference key;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  local_28.field_1 = iter.field_1;
  local_28.ctrl_ = iter.ctrl_;
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  pbVar1 = (args_1->
           super__Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
           super__Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false>
           ._M_head_impl;
  pbVar2 = (args_2->
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
           ._M_head_impl;
  uVar4 = *(undefined4 *)((long)&pbVar1->_M_len + 4);
  uVar5 = *(undefined4 *)&pbVar1->_M_str;
  uVar6 = *(undefined4 *)((long)&pbVar1->_M_str + 4);
  *(int *)local_28.field_1.slot_ = (int)pbVar1->_M_len;
  *(undefined4 *)((long)local_28.field_1.slot_ + 4) = uVar4;
  *(undefined4 *)((long)local_28.field_1.slot_ + 8) = uVar5;
  *(undefined4 *)((long)local_28.field_1.slot_ + 0xc) = uVar6;
  *(undefined4 **)((long)local_28.field_1.slot_ + 0x10) =
       (undefined4 *)((long)local_28.field_1.slot_ + 0x20);
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)local_28.field_1.slot_ + 0x10),pcVar3,
             pcVar3 + pbVar2->_M_string_length);
  CommonFields::set_capacity((CommonFields *)this,c);
  key = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::iterator::operator*(&local_28);
  local_38 = find<std::basic_string_view<char,std::char_traits<char>>>(this,&key->first);
  local_48.ctrl_ = local_28.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_28.field_1;
  bVar7 = container_internal::operator==(&local_38,&local_48);
  if (bVar7) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string_view<char> &>, std::tuple<const std::basic_string<char> &>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }